

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

int __thiscall
capnp::TwoPartyVatNetwork::accept
          (TwoPartyVatNetwork *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  SourceLocation location;
  undefined8 unaff_RBX;
  undefined4 in_register_00000034;
  long lVar1;
  PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
  paf;
  FixVoid<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  local_38;
  OwnPromiseNode local_28;
  Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>,_std::nullptr_t>
  in_stack_ffffffffffffffe0;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  if ((*(short *)(lVar1 + 0x34) == 0) && (*(char *)(lVar1 + 0x138) == '\0')) {
    *(undefined1 *)(lVar1 + 0x138) = 1;
    local_38.disposer = (Disposer *)(lVar1 + 0x348);
    *(int *)(lVar1 + 0x360) = *(int *)(lVar1 + 0x360) + 1;
    local_38.ptr = (Connection *)(lVar1 + 8);
    kj::
    Promise<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
    ::Promise((Promise<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
               *)this,&local_38);
    kj::
    Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
    ::dispose(&local_38);
  }
  else {
    location._16_8_ = unaff_RBX;
    location._0_16_ = in_stack_ffffffffffffffe0;
    kj::
    newPromiseAndFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>
              (location);
    kj::
    Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>,_std::nullptr_t>
    ::operator=((Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>,_std::nullptr_t>
                 *)(lVar1 + 0x2f0),
                (Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>,_std::nullptr_t>
                 *)&stack0xffffffffffffffe0);
    (this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase =
         (_func_int **)local_28.ptr;
    local_28.ptr = (PromiseNode *)0x0;
    kj::
    PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
    ::~PromiseFulfillerPair
              ((PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
                *)&local_28);
  }
  return (int)this;
}

Assistant:

kj::Promise<kj::Own<TwoPartyVatNetworkBase::Connection>> TwoPartyVatNetwork::accept() {
  if (side == rpc::twoparty::Side::SERVER && !accepted) {
    accepted = true;
    return asConnection();
  } else {
    // Create a promise that will never be fulfilled.
    auto paf = kj::newPromiseAndFulfiller<kj::Own<TwoPartyVatNetworkBase::Connection>>();
    acceptFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}